

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::ImageTransition::logSubmit
          (ImageTransition *this,TestLog *log,size_t commandIndex)

{
  int iVar1;
  MessageBuilder *pMVar2;
  undefined4 extraout_var;
  Bitfield<32UL> local_218;
  Bitfield<32UL> local_200;
  Bitfield<32UL> local_1e8;
  Bitfield<32UL> local_1d0;
  char *local_1b8 [3];
  MessageBuilder local_1a0;
  size_t local_20;
  size_t commandIndex_local;
  TestLog *log_local;
  ImageTransition *this_local;
  
  local_20 = commandIndex;
  commandIndex_local = (size_t)log;
  log_local = (TestLog *)this;
  tcu::TestLog::operator<<(&local_1a0,log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,&local_20);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [2])0x137f180);
  iVar1 = (*(this->super_CmdCommand)._vptr_CmdCommand[2])();
  local_1b8[0] = (char *)CONCAT44(extraout_var,iVar1);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1b8);
  pMVar2 = tcu::MessageBuilder::operator<<
                     (pMVar2,(char (*) [35])" Image transition pipeline barrier");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])", srcStages: ");
  ::vk::getPipelineStageFlagsStr(&local_1d0,this->m_srcStages);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1d0);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])", srcAccesses: ");
  ::vk::getAccessFlagsStr(&local_1e8,this->m_srcAccesses);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e8);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])", dstStages: ");
  ::vk::getPipelineStageFlagsStr(&local_200,this->m_dstStages);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_200);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [16])", dstAccesses: ");
  ::vk::getAccessFlagsStr(&local_218,this->m_dstAccesses);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_218);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])", srcLayout: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_srcLayout);
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [14])", dstLayout: ");
  pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&this->m_dstLayout);
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  return;
}

Assistant:

void ImageTransition::logSubmit (TestLog& log, size_t commandIndex) const
{
	log << TestLog::Message << commandIndex << ":" << getName()
		<< " Image transition pipeline barrier"
		<< ", srcStages: " << vk::getPipelineStageFlagsStr(m_srcStages) << ", srcAccesses: " << vk::getAccessFlagsStr(m_srcAccesses)
		<< ", dstStages: " << vk::getPipelineStageFlagsStr(m_dstStages) << ", dstAccesses: " << vk::getAccessFlagsStr(m_dstAccesses)
		<< ", srcLayout: " << m_srcLayout << ", dstLayout: " << m_dstLayout << TestLog::EndMessage;
}